

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

Expression * slang::ast::AssertionInstanceExpression::makeDefault(Symbol *symbol)

{
  Symbol *pSVar1;
  group_type_pointer pgVar2;
  char *pcVar3;
  undefined4 uVar4;
  Scope *pSVar5;
  Compilation *this;
  opt_storage<const_slang::ast::Symbol_*> formal;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Symbol *args_1;
  char acVar9 [8];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  ulong uVar14;
  AssertionInstanceExpression *pAVar15;
  AssertionExpr *args_2;
  undefined4 extraout_var;
  value_type *elements;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  SyntaxKind typeKind;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  SourceLocation outputLocalVarArgLoc;
  iterator __begin2;
  opt_storage<const_slang::ast::Symbol_*> *poVar21;
  PropertySymbol *prop;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  byte bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  LookupLocation LVar28;
  try_emplace_args_t local_1f1;
  Type *local_1f0;
  SmallVector<const_slang::ast::Symbol_*,_5UL> localVars;
  locator res_1;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_const_slang::ast::AssertionPortSymbol_*&,_void>
  x;
  undefined1 local_150 [24];
  size_t local_138;
  ulong local_130;
  group_type_pointer local_128;
  value_type_pointer local_120;
  size_ctrl_type local_118;
  size_t local_108;
  size_t local_100;
  undefined1 *local_f8;
  value_type_pointer local_f0;
  size_ctrl_type local_e8;
  undefined1 local_d8 [16];
  bool local_c8;
  Symbol *local_c0;
  opt_storage<const_slang::ast::Symbol_*> *local_b8;
  PropertyExprSyntax *local_b0;
  SourceRange range;
  undefined1 local_90 [24];
  char acStack_78 [8];
  undefined1 local_70 [16];
  char local_60 [9];
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  pSVar5 = symbol->parentScope;
  LVar28 = LookupLocation::before(symbol);
  local_90._8_4_ = LVar28.index;
  stack0xffffffffffffff80 = (undefined1  [16])0x0;
  local_70 = (undefined1  [16])0x0;
  local_60[0] = '\0';
  local_60[1] = '\0';
  local_60[2] = '\0';
  local_60[3] = '\0';
  local_60[4] = '\0';
  local_60[5] = '\0';
  local_60[6] = '\0';
  local_60[7] = '\0';
  this = pSVar5->compilation;
  local_90._0_8_ = pSVar5;
  if (symbol->kind == LetDecl) {
    local_1f0 = this->voidType;
  }
  else {
    if (symbol->kind == Property) {
      typeKind = PropertyType;
    }
    else {
      typeKind = SequenceType;
    }
    local_1f0 = Compilation::getType(this,typeKind);
  }
  pSVar1 = symbol + 1;
  poVar21 = (opt_storage<const_slang::ast::Symbol_*> *)symbol[1].originatingSyntax;
  local_138 = 0x3f;
  local_130 = 1;
  outputLocalVarArgLoc = (SourceLocation)0x0;
  local_120 = (value_type_pointer)0x0;
  local_128 = (group_type_pointer)
              boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
  local_118.ml = 0;
  local_118.size = 0;
  local_108 = 0x3f;
  local_100 = 1;
  local_f0 = (value_type_pointer)0x0;
  local_f8 = boost::unordered::detail::foa::
             dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
             ::storage;
  local_e8.ml = 0;
  local_e8.size = 0;
  local_d8 = (undefined1  [16])0x0;
  local_c8 = false;
  local_150._8_8_ = local_90;
  local_150._16_8_ = symbol->location;
  local_150._0_8_ = symbol;
  local_c0 = symbol;
  if (*(long *)(symbol + 2) != 0) {
    local_b8 = poVar21 + *(long *)(symbol + 2);
    outputLocalVarArgLoc = (SourceLocation)0x0;
    do {
      auVar26 = local_70;
      auVar7 = stack0xffffffffffffff80;
      formal = (opt_storage<const_slang::ast::Symbol_*>)poVar21->t_;
      if (*(PropertyExprSyntax **)(formal.t_ + 2) == (PropertyExprSyntax *)0x0) {
        uVar12._0_1_ = local_60[0];
        uVar12._1_1_ = local_60[1];
        uVar12._2_1_ = local_60[2];
        uVar12._3_1_ = local_60[3];
        uVar12._4_1_ = local_60[4];
        uVar12._5_1_ = local_60[5];
        uVar12._6_1_ = local_60[6];
        uVar12._7_1_ = local_60[7];
        localVars.stackBase[0x10] = local_60[0];
        localVars.stackBase[0x11] = local_60[1];
        localVars.stackBase[0x12] = local_60[2];
        localVars.stackBase[0x13] = local_60[3];
        localVars.stackBase[0x14] = local_60[4];
        localVars.stackBase[0x15] = local_60[5];
        localVars.stackBase[0x16] = local_60[6];
        localVars.stackBase[0x17] = local_60[7];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)local_90._0_8_;
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len =
             CONCAT44(local_90._12_4_,local_90._8_4_);
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = local_90._16_8_;
        acVar9[0] = acStack_78[0];
        acVar9[1] = acStack_78[1];
        acVar9[2] = acStack_78[2];
        acVar9[3] = acStack_78[3];
        acVar9[4] = acStack_78[4];
        acVar9[5] = acStack_78[5];
        acVar9[6] = acStack_78[6];
        acVar9[7] = acStack_78[7];
        uVar10._0_1_ = local_70[0];
        uVar10._1_1_ = local_70[1];
        uVar10._2_1_ = local_70[2];
        uVar10._3_1_ = local_70[3];
        uVar10._4_1_ = local_70[4];
        uVar10._5_1_ = local_70[5];
        uVar10._6_1_ = local_70[6];
        uVar10._7_1_ = local_70[7];
        local_70._8_8_ = auVar26._8_8_;
        uVar11._0_1_ = local_70[8];
        uVar11._1_1_ = local_70[9];
        uVar11._2_1_ = local_70[10];
        uVar11._3_1_ = local_70[0xb];
        uVar11._4_1_ = local_70[0xc];
        uVar11._5_1_ = local_70[0xd];
        uVar11._6_1_ = local_70[0xe];
        uVar11._7_1_ = local_70[0xf];
        localVars.stackBase[0] = local_70[0];
        localVars.stackBase[1] = local_70[1];
        localVars.stackBase[2] = local_70[2];
        localVars.stackBase[3] = local_70[3];
        localVars.stackBase[4] = local_70[4];
        localVars.stackBase[5] = local_70[5];
        localVars.stackBase[6] = local_70[6];
        localVars.stackBase[7] = local_70[7];
        localVars.stackBase[8] = local_70[8];
        localVars.stackBase[9] = local_70[9];
        localVars.stackBase[10] = local_70[10];
        localVars.stackBase[0xb] = local_70[0xb];
        localVars.stackBase[0xc] = local_70[0xc];
        localVars.stackBase[0xd] = local_70[0xd];
        localVars.stackBase[0xe] = local_70[0xe];
        localVars.stackBase[0xf] = local_70[0xf];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[0] = acStack_78[0];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[1] = acStack_78[1];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[2] = acStack_78[2];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[3] = acStack_78[3];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[4] = acStack_78[4];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[5] = acStack_78[5];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[6] = acStack_78[6];
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[7] = acStack_78[7];
        auVar8._8_8_ = 0;
        auVar8._0_8_ = formal;
        uVar16 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar14 = uVar16 >> ((byte)local_138._0_1_ & 0x3f);
        localVars.stackBase[0x18] = '\0';
        localVars.stackBase[0x19] = '\0';
        localVars.stackBase[0x1a] = '\0';
        localVars.stackBase[0x1b] = '\0';
        localVars.stackBase[0x1c] = '\0';
        localVars.stackBase[0x1d] = '\0';
        localVars.stackBase[0x1e] = '\0';
        localVars.stackBase[0x1f] = '\0';
        uVar4 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar16 & 0xff];
        uVar19 = 0;
        uVar18 = uVar14;
        do {
          pgVar2 = local_128 + uVar18;
          local_60[8] = pgVar2->m[0].n;
          uStack_57 = pgVar2->m[1].n;
          uStack_56 = pgVar2->m[2].n;
          bStack_55 = pgVar2->m[3].n;
          uStack_54 = pgVar2->m[4].n;
          uStack_53 = pgVar2->m[5].n;
          uStack_52 = pgVar2->m[6].n;
          bStack_51 = pgVar2->m[7].n;
          uStack_50 = pgVar2->m[8].n;
          uStack_4f = pgVar2->m[9].n;
          uStack_4e = pgVar2->m[10].n;
          bStack_4d = pgVar2->m[0xb].n;
          uStack_4c = pgVar2->m[0xc].n;
          uStack_4b = pgVar2->m[0xd].n;
          uStack_4a = pgVar2->m[0xe].n;
          bStack_49 = pgVar2->m[0xf].n;
          uVar22 = (uchar)uVar4;
          auVar27[0] = -(local_60[8] == uVar22);
          uVar23 = (uchar)((uint)uVar4 >> 8);
          auVar27[1] = -(uStack_57 == uVar23);
          uVar24 = (uchar)((uint)uVar4 >> 0x10);
          auVar27[2] = -(uStack_56 == uVar24);
          bVar25 = (byte)((uint)uVar4 >> 0x18);
          auVar27[3] = -(bStack_55 == bVar25);
          auVar27[4] = -(uStack_54 == uVar22);
          auVar27[5] = -(uStack_53 == uVar23);
          auVar27[6] = -(uStack_52 == uVar24);
          auVar27[7] = -(bStack_51 == bVar25);
          auVar27[8] = -(uStack_50 == uVar22);
          auVar27[9] = -(uStack_4f == uVar23);
          auVar27[10] = -(uStack_4e == uVar24);
          auVar27[0xb] = -(bStack_4d == bVar25);
          auVar27[0xc] = -(uStack_4c == uVar22);
          auVar27[0xd] = -(uStack_4b == uVar23);
          auVar27[0xe] = -(uStack_4a == uVar24);
          auVar27[0xf] = -(bStack_49 == bVar25);
          for (uVar20 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
              range.startLoc = (SourceLocation)formal, unique0x10000da5 = auVar7, local_70 = auVar26
              , uVar20 != 0; uVar20 = uVar20 - 1 & uVar20) {
            uVar6 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            if ((AssertionPortSymbol *)formal.t_ ==
                (AssertionPortSymbol *)local_120[uVar18 * 0xf + (ulong)uVar6].first)
            goto LAB_00417663;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bStack_49) == 0)
          break;
          lVar17 = uVar18 + uVar19;
          uVar19 = uVar19 + 1;
          uVar18 = lVar17 + 1U & local_130;
        } while (uVar19 <= local_130);
        if (local_118.size < local_118.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax*,slang::ast::ASTContext>>
                    (&res_1,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                             *)&local_138,(arrays_type *)&local_138,uVar14,uVar16,
                     (try_emplace_args_t *)&x,(Symbol **)&range,
                     (tuple<slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                     &localVars);
          local_118.size = local_118.size + 1;
          acVar9 = localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement;
          uVar10 = localVars.stackBase._0_8_;
          uVar11 = localVars.stackBase._8_8_;
          uVar12 = localVars.stackBase._16_8_;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax*,slang::ast::ASTContext>>
                    (&res_1,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                             *)&local_138,uVar16,(try_emplace_args_t *)&x,(Symbol **)&range,
                     (tuple<slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                     &localVars);
          acVar9 = localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement;
          uVar10 = localVars.stackBase._0_8_;
          uVar11 = localVars.stackBase._8_8_;
          uVar12 = localVars.stackBase._16_8_;
        }
      }
      else {
        LVar28 = LookupLocation::after(formal.t_);
        res_1.n = LVar28.index;
        localVars.stackBase._16_8_ = local_150;
        res_1.p = (pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>
                   *)0x2000000000;
        localVars.stackBase._24_8_ = *(undefined8 *)(formal.t_ + 2);
        localVars.stackBase[0] = '\0';
        localVars.stackBase[1] = '\0';
        localVars.stackBase[2] = '\0';
        localVars.stackBase[3] = '\0';
        localVars.stackBase[4] = '\0';
        localVars.stackBase[5] = '\0';
        localVars.stackBase[6] = '\0';
        localVars.stackBase[7] = '\0';
        localVars.stackBase[8] = '\0';
        localVars.stackBase[9] = '\0';
        localVars.stackBase[10] = '\0';
        localVars.stackBase[0xb] = '\0';
        localVars.stackBase[0xc] = '\0';
        localVars.stackBase[0xd] = '\0';
        localVars.stackBase[0xe] = '\0';
        localVars.stackBase[0xf] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 0x2000000000;
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[0] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[1] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[2] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[3] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[4] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[5] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[6] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement[7] = '\0';
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len =
             CONCAT44(res_1._12_4_,res_1.n);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = formal;
        uVar16 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar14 = uVar16 >> ((byte)local_138._0_1_ & 0x3f);
        uVar4 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar16 & 0xff];
        uVar19 = 0;
        uVar18 = uVar14;
        do {
          pgVar2 = local_128 + uVar18;
          local_48 = pgVar2->m[0].n;
          uStack_47 = pgVar2->m[1].n;
          uStack_46 = pgVar2->m[2].n;
          bStack_45 = pgVar2->m[3].n;
          uStack_44 = pgVar2->m[4].n;
          uStack_43 = pgVar2->m[5].n;
          uStack_42 = pgVar2->m[6].n;
          bStack_41 = pgVar2->m[7].n;
          uStack_40 = pgVar2->m[8].n;
          uStack_3f = pgVar2->m[9].n;
          uStack_3e = pgVar2->m[10].n;
          bStack_3d = pgVar2->m[0xb].n;
          uStack_3c = pgVar2->m[0xc].n;
          uStack_3b = pgVar2->m[0xd].n;
          uStack_3a = pgVar2->m[0xe].n;
          bStack_39 = pgVar2->m[0xf].n;
          uVar22 = (uchar)uVar4;
          auVar26[0] = -(local_48 == uVar22);
          uVar23 = (uchar)((uint)uVar4 >> 8);
          auVar26[1] = -(uStack_47 == uVar23);
          uVar24 = (uchar)((uint)uVar4 >> 0x10);
          auVar26[2] = -(uStack_46 == uVar24);
          bVar25 = (byte)((uint)uVar4 >> 0x18);
          auVar26[3] = -(bStack_45 == bVar25);
          auVar26[4] = -(uStack_44 == uVar22);
          auVar26[5] = -(uStack_43 == uVar23);
          auVar26[6] = -(uStack_42 == uVar24);
          auVar26[7] = -(bStack_41 == bVar25);
          auVar26[8] = -(uStack_40 == uVar22);
          auVar26[9] = -(uStack_3f == uVar23);
          auVar26[10] = -(uStack_3e == uVar24);
          auVar26[0xb] = -(bStack_3d == bVar25);
          auVar26[0xc] = -(uStack_3c == uVar22);
          auVar26[0xd] = -(uStack_3b == uVar23);
          auVar26[0xe] = -(uStack_3a == uVar24);
          auVar26[0xf] = -(bStack_39 == bVar25);
          for (uVar20 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
              x.val.storage = formal, local_b0 = (PropertyExprSyntax *)localVars.stackBase._24_8_,
              uVar20 != 0; uVar20 = uVar20 - 1 & uVar20) {
            uVar6 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            res_1.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pSVar1;
            if ((AssertionPortSymbol *)formal.t_ ==
                (AssertionPortSymbol *)local_120[uVar18 * 0xf + (ulong)uVar6].first)
            goto LAB_00417638;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bStack_39) == 0)
          break;
          lVar17 = uVar18 + uVar19;
          uVar19 = uVar19 + 1;
          uVar18 = lVar17 + 1U & local_130;
        } while (uVar19 <= local_130);
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)pSVar1;
        if (local_118.size < local_118.ml) {
          res_1.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pSVar1;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                    ((locator *)&range,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                      *)&local_138,(arrays_type *)&local_138,uVar14,uVar16,&local_1f1,(Symbol **)&x,
                     (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                     &localVars);
          local_118.size = local_118.size + 1;
        }
        else {
          res_1.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pSVar1;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                    ((locator *)&range,
                     (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
                      *)&local_138,uVar16,&local_1f1,(Symbol **)&x,
                     (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                     &localVars);
        }
LAB_00417638:
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)0x0;
        localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len =
             localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len & 0xffffffffffffff00;
        checkAssertionArg(local_b0,(AssertionPortSymbol *)formal.t_,(ASTContext *)&res_1,
                          (ActualArg *)&localVars,false);
        acVar9 = localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement;
        uVar10 = localVars.stackBase._0_8_;
        uVar11 = localVars.stackBase._8_8_;
        uVar12 = localVars.stackBase._16_8_;
      }
LAB_00417663:
      localVars.stackBase._16_8_ = uVar12;
      localVars.stackBase._8_8_ = uVar11;
      localVars.stackBase._0_8_ = uVar10;
      localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement = acVar9;
      if (((((ulong)outputLocalVarArgLoc & 0xfffffff) == 0) &&
          ((((_Optional_base<slang::ast::ArgumentDirection,_true,_true> *)&formal.t_[2].name._M_len)
           ->_M_payload).super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged ==
           true)) &&
         ((((_Optional_base<slang::ast::ArgumentDirection,_true,_true> *)&formal.t_[2].name._M_len)
          ->_M_payload).super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload.
          _M_value - Out < 2)) {
        outputLocalVarArgLoc = (formal.t_)->location;
      }
      poVar21 = poVar21 + 1;
    } while (poVar21 != local_b8);
  }
  args_1 = local_c0;
  res_1.n = 0xffffffff;
  res_1.p = (pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>
             *)0x0;
  if (local_c0->kind == LetDecl) {
    res_1.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pSVar1;
    pAVar15 = (AssertionInstanceExpression *)
              Expression::create(this,(ExpressionSyntax *)local_c0[2].name._M_len,
                                 (ASTContext *)&res_1,(bitmask<slang::ast::ASTFlags>)0x0,(Type *)0x0
                                );
  }
  else {
    pcVar3 = localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement;
    localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.len = 0;
    localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 5;
    localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)pcVar3;
    res_1.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pSVar1;
    args_2 = bindAssertionBody(local_c0,local_c0->originatingSyntax,(ASTContext *)&res_1,
                               outputLocalVarArgLoc,(AssertionInstanceDetails *)local_150,
                               &localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>);
    range.startLoc = args_1->location;
    range.endLoc = (SourceLocation)
                   ((long)range.startLoc * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
                   (ulong)(range.startLoc._0_4_ & 0xfffffff));
    x.val.storage.t_ = x.val.storage.t_ & 0xffffffffffffff00;
    pAVar15 = BumpAllocator::
              emplace<slang::ast::AssertionInstanceExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::AssertionExpr_const&,bool,slang::SourceRange&>
                        (&this->super_BumpAllocator,local_1f0,args_1,args_2,(bool *)&x,&range);
    iVar13 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                       (&localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>,
                        (EVP_PKEY_CTX *)this,src);
    (pAVar15->localVars)._M_ptr = (pointer)CONCAT44(extraout_var,iVar13);
    (pAVar15->localVars)._M_extent._M_extent_value = extraout_RDX;
    if (localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ != (pointer)pcVar3) {
      operator_delete(localVars.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_);
    }
  }
  if (local_f0 != (value_type_pointer)0x0) {
    operator_delete(local_f0,((local_100 * 0x178 + 0x186) / 3 & 0xfffffffffffffff8) * 3);
  }
  if (local_120 != (value_type_pointer)0x0) {
    operator_delete(local_120,((local_130 * 0x448 + 0x456) / 9 & 0xfffffffffffffff8) * 9);
  }
  return &pAVar15->super_Expression;
}

Assistant:

Expression& AssertionInstanceExpression::makeDefault(const Symbol& symbol) {
    auto parentScope = symbol.getParentScope();
    SLANG_ASSERT(parentScope);

    ASTContext context(*parentScope, LookupLocation::before(symbol));
    auto& comp = context.getCompilation();
    const Type* type;
    const Scope* symbolScope;
    std::span<const AssertionPortSymbol* const> formalPorts;

    switch (symbol.kind) {
        case SymbolKind::Sequence: {
            auto& seq = symbol.as<SequenceSymbol>();
            type = &comp.getType(SyntaxKind::SequenceType);
            formalPorts = seq.ports;
            symbolScope = &seq;
            break;
        }
        case SymbolKind::Property: {
            auto& prop = symbol.as<PropertySymbol>();
            type = &comp.getType(SyntaxKind::PropertyType);
            formalPorts = prop.ports;
            symbolScope = &prop;
            break;
        }
        case SymbolKind::LetDecl: {
            auto& let = symbol.as<LetDeclSymbol>();
            type = &comp.getVoidType();
            formalPorts = let.ports;
            symbolScope = &let;
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }

    AssertionInstanceDetails instance;
    instance.symbol = &symbol;
    instance.prevContext = &context;
    instance.instanceLoc = symbol.location;

    // Bind default args, make placeholder entries for args that don't have defaults.
    SourceLocation outputLocalVarArgLoc;
    for (auto formal : formalPorts) {
        if (!formal->defaultValueSyntax) {
            instance.argumentMap.emplace(formal,
                                         std::make_tuple((PropertyExprSyntax*)nullptr, context));
        }
        else {
            ASTContext ctx(*symbolScope, LookupLocation::after(*formal));
            ctx.assertionInstance = &instance;
            ctx.flags |= ASTFlags::AssertionDefaultArg;

            auto expr = formal->defaultValueSyntax;
            instance.argumentMap.emplace(formal, std::make_tuple(expr, ctx));

            ActualArg arg;
            checkAssertionArg(*expr, *formal, ctx, arg, false);
        }

        if (!outputLocalVarArgLoc && (formal->direction == ArgumentDirection::InOut ||
                                      formal->direction == ArgumentDirection::Out)) {
            outputLocalVarArgLoc = formal->location;
        }
    }

    ASTContext bodyContext(*symbolScope, LookupLocation::max);
    bodyContext.assertionInstance = &instance;

    // Let declarations expand directly to an expression.
    if (symbol.kind == SymbolKind::LetDecl)
        return create(comp, *symbol.as<LetDeclSymbol>().exprSyntax, bodyContext);

    auto bodySyntax = symbol.getSyntax();
    SLANG_ASSERT(bodySyntax);

    SmallVector<const Symbol*> localVars;
    auto& body = bindAssertionBody(symbol, *bodySyntax, bodyContext, outputLocalVarArgLoc, instance,
                                   localVars);

    SourceRange range{symbol.location, symbol.location + 1};
    auto result = comp.emplace<AssertionInstanceExpression>(*type, symbol, body,
                                                            /* isRecursiveProperty */ false, range);
    result->localVars = localVars.copy(comp);
    return *result;
}